

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_ParseMethodToCommand
          (char *method_name,char **component_name,char **command_name)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  char *__dest;
  IOTHUB_CLIENT_RESULT IVar3;
  size_t __size;
  size_t __n;
  
  if ((component_name == (char **)0x0 || method_name == (char *)0x0) || command_name == (char **)0x0
     ) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_ParseMethodToCommand",0x2f6,1,
                "Invalid parameter for IoTHubClientCore_LL_ParseMethodToCommand");
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    return IOTHUB_CLIENT_INVALID_ARG;
  }
  pcVar2 = strchr(method_name,0x2a);
  if (pcVar2 == (char *)0x0) {
    *component_name = (char *)0x0;
    *command_name = method_name;
LAB_001208a4:
    IVar3 = IOTHUB_CLIENT_OK;
  }
  else {
    __n = (long)pcVar2 - (long)method_name;
    if (pcVar2 < method_name) {
      __n = 0xffffffffffffffff;
    }
    __size = __n + 1;
    if (__size == 0) {
      __size = 0xffffffffffffffff;
    }
    if (__size != 0xffffffffffffffff) {
      __dest = (char *)malloc(__size);
      *component_name = __dest;
      if (__dest != (char *)0x0) {
        memcpy(__dest,method_name,__n);
        __dest[__n] = '\0';
        *command_name = pcVar2 + 1;
        goto LAB_001208a4;
      }
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_ParseMethodToCommand",0x30a,1,
                "Cannot allocate component name, size:%zu",__size);
    }
    *component_name = (char *)0x0;
    IVar3 = IOTHUB_CLIENT_ERROR;
  }
  return IVar3;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_ParseMethodToCommand(const char* method_name, char** component_name, const char** command_name)
{
    IOTHUB_CLIENT_RESULT result;

    if ((method_name == NULL) || (component_name == NULL) || (command_name == NULL))
    {
        LogError("Invalid parameter for IoTHubClientCore_LL_ParseMethodToCommand");
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        const char* componentSplit = strchr(method_name, COMPONENT_DELIMETER);

        if (componentSplit == NULL)
        {
            *component_name = NULL;
            *command_name = method_name;
            result = IOTHUB_CLIENT_OK;
        }
        else
        {
            size_t component_name_length = safe_subtract_size_t(componentSplit, method_name);
            size_t malloc_size = safe_add_size_t(component_name_length, 1);
            if (malloc_size == SIZE_MAX ||
                (*component_name = malloc(malloc_size)) == NULL)
            {
                LogError("Cannot allocate component name, size:%zu", malloc_size);
                result = IOTHUB_CLIENT_ERROR;
                *component_name = NULL;
            }
            else
            {
                memcpy(*component_name, method_name, component_name_length);
                (*component_name)[component_name_length] = 0;
                *command_name = componentSplit + 1;
                result = IOTHUB_CLIENT_OK;
            }
        }
    }

    return result;
}